

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int get32_packet(vorb *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32 x;
  vorb *f_local;
  
  iVar1 = get8_packet(f);
  iVar2 = get8_packet(f);
  iVar3 = get8_packet(f);
  iVar4 = get8_packet(f);
  return iVar4 * 0x1000000 + iVar3 * 0x10000 + iVar2 * 0x100 + iVar1;
}

Assistant:

static int get32_packet(vorb *f)
{
   uint32 x;
   x = get8_packet(f);
   x += get8_packet(f) << 8;
   x += get8_packet(f) << 16;
   x += (uint32) get8_packet(f) << 24;
   return x;
}